

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::iterate(BBoxRenderCase *this)

{
  int iVar1;
  TestLog *log;
  size_type sVar2;
  reference pvVar3;
  IterationConfig *config;
  string local_1a0;
  int local_17c;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  int local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ScopedLogSection local_20;
  ScopedLogSection section;
  BBoxRenderCase *this_local;
  
  section.m_log = (TestLog *)this;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::__cxx11::string::string((string *)&local_80);
  std::operator+(&local_60,&local_80,"Iteration");
  local_b4 = this->m_iteration;
  de::toString<int>(&local_b0,&local_b4);
  std::operator+(&local_40,&local_60,&local_b0);
  std::__cxx11::string::string((string *)&local_158);
  std::operator+(&local_138,&local_158,"Iteration ");
  local_17c = this->m_iteration + 1;
  de::toString<int>(&local_178,&local_17c);
  std::operator+(&local_118,&local_138,&local_178);
  std::operator+(&local_f8,&local_118,"/");
  sVar2 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ::size(&this->m_iterationConfigs);
  config._4_4_ = (undefined4)sVar2;
  de::toString<int>(&local_1a0,(int *)((long)&config + 4));
  std::operator+(&local_d8,&local_f8,&local_1a0);
  tcu::ScopedLogSection::ScopedLogSection(&local_20,log,&local_40,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  pvVar3 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ::operator[](&this->m_iterationConfigs,(long)this->m_iteration);
  if (this->m_iteration == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])(this,pvVar3);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xd])(this,pvVar3);
  iVar1 = this->m_iteration + 1;
  this->m_iteration = iVar1;
  sVar2 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
          ::size(&this->m_iterationConfigs);
  this_local._4_4_ = (IterateResult)(iVar1 < (int)sVar2);
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return this_local._4_4_;
}

Assistant:

BBoxRenderCase::IterateResult BBoxRenderCase::iterate (void)
{
	const tcu::ScopedLogSection	section		(m_testCtx.getLog(),
											 std::string() + "Iteration" + de::toString((int)m_iteration),
											 std::string() + "Iteration " + de::toString((int)m_iteration+1) + "/" + de::toString((int)m_iterationConfigs.size()));
	const IterationConfig&		config		= m_iterationConfigs[m_iteration];

	// default
	if (m_iteration == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	renderTestPattern(config);
	verifyRenderResult(config);

	if (++m_iteration < (int)m_iterationConfigs.size())
		return CONTINUE;

	return STOP;
}